

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nva.c
# Opt level: O1

int nva_init(void)

{
  int iVar1;
  long lVar2;
  pci_device *ppVar3;
  nva_card *pnVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  iVar1 = pci_system_init();
  uVar5 = 0xffffffff;
  if (iVar1 == 0) {
    nva_vgaarberr = pci_device_vgaarb_init();
    lVar8 = 0;
    do {
      if (nva_types[lVar8].len != 0) {
        uVar7 = 0;
        do {
          lVar2 = pci_id_match_iterator_create(nva_types[lVar8].match + uVar7);
          if (lVar2 == 0) {
            pci_system_cleanup();
          }
          else {
            while (ppVar3 = (pci_device *)pci_device_next(lVar2), ppVar3 != (pci_device *)0x0) {
              iVar1 = pci_device_probe(ppVar3);
              if (iVar1 == 0) {
                pci_device_enable(ppVar3);
                pnVar4 = (*nva_types[lVar8].func)(ppVar3);
                if (pnVar4 != (nva_card *)0x0) {
                  if (nva_cardsmax <= nva_cardsnum) {
                    iVar1 = nva_cardsmax * 2;
                    if (nva_cardsmax == 0) {
                      iVar1 = 0x10;
                    }
                    nva_cardsmax = iVar1;
                    nva_cards = (nva_card **)realloc(nva_cards,(long)iVar1 << 3);
                  }
                  lVar6 = (long)nva_cardsnum;
                  nva_cardsnum = nva_cardsnum + 1;
                  nva_cards[lVar6] = pnVar4;
                }
              }
              else {
                nva_init_cold_1();
              }
            }
            pci_iterator_destroy(lVar2);
          }
          if (lVar2 == 0) {
            return -1;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < nva_types[lVar8].len);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    pnVar4 = nva_init_platform();
    if (pnVar4 != (nva_card *)0x0) {
      if (nva_cardsmax <= nva_cardsnum) {
        iVar1 = nva_cardsmax * 2;
        bVar9 = nva_cardsmax != 0;
        nva_cardsmax = 0x10;
        if (bVar9) {
          nva_cardsmax = iVar1;
        }
        nva_cards = (nva_card **)realloc(nva_cards,(long)nva_cardsmax << 3);
      }
      lVar8 = (long)nva_cardsnum;
      nva_cardsnum = nva_cardsnum + 1;
      nva_cards[lVar8] = pnVar4;
    }
    uVar5 = (uint)(nva_cardsnum == 0);
  }
  return uVar5;
}

Assistant:

int nva_init() {
	int ret;
	ret = pci_system_init();
	if (ret)
		return -1;
	nva_vgaarberr = pci_device_vgaarb_init();
	int i, j;

	for (i = 0; i < ARRAY_SIZE(nva_types); i++) {
		for (j = 0; j < nva_types[i].len; j++) {
			struct pci_device_iterator* it = pci_id_match_iterator_create(&nva_types[i].match[j]);
			if (!it) {
				pci_system_cleanup();
				return -1;
			}

			struct pci_device *dev;
			while ((dev = pci_device_next(it))) {
				ret = pci_device_probe(dev);
				if (ret) {
					fprintf (stderr, "WARN: Can't probe %04x:%02x:%02x.%x\n", dev->domain, dev->bus, dev->dev, dev->func);
					continue;
				}
				pci_device_enable(dev);
				struct nva_card *card = nva_types[i].func(dev);
				if (card)
					ADDARRAY(nva_cards, card);
			}
			pci_iterator_destroy(it);
		}
	}

	/* Finally, try reading the platform */
	struct nva_card *card = nva_init_platform();
	if (card)
		ADDARRAY(nva_cards, card);

	return (nva_cardsnum == 0);
}